

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateUnionTypeVerifier(SwiftGenerator *this,FieldDef *field)

{
  int *piVar1;
  bool bVar2;
  BaseType BVar3;
  int iVar4;
  EnumDef *def;
  EnumVal *ev;
  pointer ppEVar5;
  SwiftGenerator *pSVar6;
  string *text;
  char *__s;
  string type;
  allocator<char> local_1d9;
  CodeWriter *local_1d8;
  SwiftGenerator *local_1d0;
  string local_1c8;
  string local_1a8;
  EnumDef *local_188;
  IdlNamer *local_180;
  pointer local_178;
  string local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  BVar3 = (field->value).type.base_type;
  if (1 < BVar3 - BASE_TYPE_ARRAY) {
    if (BVar3 == BASE_TYPE_UTYPE) {
      return;
    }
    if (BVar3 != BASE_TYPE_VECTOR) {
      __s = "visit";
      goto LAB_00220b63;
    }
  }
  if ((field->value).type.element == BASE_TYPE_UTYPE) {
    return;
  }
  __s = "visitUnionVector";
LAB_00220b63:
  def = (field->value).type.enum_def;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"VALUETYPE",(allocator<char> *)&local_170);
  local_180 = &this->namer_;
  IdlNamer::NamespacedType_abi_cxx11_(&local_1a8,local_180,&def->super_Definition);
  local_1d8 = &this->code_;
  CodeWriter::SetValue(local_1d8,&local_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"FUNCTION_NAME",(allocator<char> *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,__s,(allocator<char> *)&local_110);
  CodeWriter::SetValue(local_1d8,&local_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "try _v.{{FUNCTION_NAME}}(unionKey: {{TABLEOFFSET}}.{{OFFSET}}Type.p, unionField: {{TABLEOFFSET}}.{{OFFSET}}.p, unionKeyName: \"{{FIELDVAR}}Type\", fieldName: \"{{FIELDVAR}}\", required: {{ISREQUIRED}}, completion: { (verifier, key: {{VALUETYPE}}, pos) in"
             ,(allocator<char> *)&local_1c8);
  CodeWriter::operator+=(local_1d8,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  piVar1 = &(this->code_).cur_ident_lvl_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"switch key {",(allocator<char> *)&local_1c8);
  CodeWriter::operator+=(local_1d8,&local_f0);
  local_1d0 = this;
  std::__cxx11::string::~string((string *)&local_f0);
  ppEVar5 = (def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_188 = def;
  while (ppEVar5 !=
         (local_188->vals).vec.
         super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl
         .super__Vector_impl_data._M_finish) {
    ev = *ppEVar5;
    local_178 = ppEVar5;
    GenType_abi_cxx11_(&local_1c8,local_1d0,&ev->union_type,false);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"KEY",&local_1d9);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&local_170,local_180,ev);
    CodeWriter::SetValue(local_1d8,&local_1a8,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"VALUETYPE",(allocator<char> *)&local_170);
    CodeWriter::SetValue(local_1d8,&local_1a8,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"case .{{KEY}}:",(allocator<char> *)&local_1a8);
    CodeWriter::operator+=(local_1d8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(local_1d0->code_).cur_ident_lvl_;
    *piVar1 = *piVar1 + 1;
    BVar3 = (ev->union_type).base_type;
    if (BVar3 == BASE_TYPE_STRING) {
      text = &local_90;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)text,
                 "try ForwardOffset<String>.verify(&verifier, at: pos, of: String.self)",
                 (allocator<char> *)&local_1a8);
      CodeWriter::operator+=(local_1d8,text);
      pSVar6 = local_1d0;
    }
    else if (BVar3 == BASE_TYPE_NONE) {
      text = &local_70;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)text,"break // NOTE - SWIFT doesnt support none",
                 (allocator<char> *)&local_1a8);
      pSVar6 = local_1d0;
      CodeWriter::operator+=(local_1d8,text);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"MAINTYPE",&local_1d9)
      ;
      pSVar6 = local_1d0;
      bVar2 = ((ev->union_type).struct_def)->fixed;
      if (bVar2 == true) {
        std::__cxx11::string::string((string *)&local_170,(string *)&local_1c8);
      }
      else {
        std::operator+(&local_110,"ForwardOffset<",&local_1c8);
        std::operator+(&local_170,&local_110,">");
      }
      CodeWriter::SetValue(local_1d8,&local_1a8,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      if (bVar2 == false) {
        std::__cxx11::string::~string((string *)&local_110);
      }
      std::__cxx11::string::~string((string *)&local_1a8);
      text = &local_b0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)text,
                 "try {{MAINTYPE}}.verify(&verifier, at: pos, of: {{VALUETYPE}}.self)",
                 (allocator<char> *)&local_1a8);
      CodeWriter::operator+=(local_1d8,text);
    }
    std::__cxx11::string::~string((string *)text);
    iVar4 = (pSVar6->code_).cur_ident_lvl_;
    if (iVar4 != 0) {
      (pSVar6->code_).cur_ident_lvl_ = iVar4 + -1;
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    ppEVar5 = local_178 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"}",(allocator<char> *)&local_1c8);
  CodeWriter::operator+=(local_1d8,&local_130);
  pSVar6 = local_1d0;
  std::__cxx11::string::~string((string *)&local_130);
  iVar4 = (pSVar6->code_).cur_ident_lvl_;
  if (iVar4 != 0) {
    (pSVar6->code_).cur_ident_lvl_ = iVar4 + -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"})",(allocator<char> *)&local_1c8);
  CodeWriter::operator+=(local_1d8,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

void GenerateUnionTypeVerifier(const FieldDef &field) {
    const auto is_vector =
        IsVector(field.value.type) || IsArray(field.value.type);
    if (field.value.type.base_type == BASE_TYPE_UTYPE ||
        (is_vector &&
         field.value.type.VectorType().base_type == BASE_TYPE_UTYPE))
      return;
    EnumDef &union_def = *field.value.type.enum_def;
    code_.SetValue("VALUETYPE", namer_.NamespacedType(union_def));
    code_.SetValue("FUNCTION_NAME", is_vector ? "visitUnionVector" : "visit");
    code_ +=
        "try _v.{{FUNCTION_NAME}}(unionKey: {{TABLEOFFSET}}.{{OFFSET}}Type.p, "
        "unionField: {{TABLEOFFSET}}.{{OFFSET}}.p, unionKeyName: "
        "\"{{FIELDVAR}}Type\", fieldName: \"{{FIELDVAR}}\", required: "
        "{{ISREQUIRED}}, completion: { (verifier, key: {{VALUETYPE}}, pos) in";
    Indent();
    code_ += "switch key {";
    for (auto it = union_def.Vals().begin(); it != union_def.Vals().end();
         ++it) {
      const auto &ev = **it;
      const auto type = GenType(ev.union_type);
      code_.SetValue("KEY", namer_.LegacySwiftVariant(ev));
      code_.SetValue("VALUETYPE", type);
      code_ += "case .{{KEY}}:";
      Indent();
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code_ += "break // NOTE - SWIFT doesnt support none";
      } else if (ev.union_type.base_type == BASE_TYPE_STRING) {
        code_ +=
            "try ForwardOffset<String>.verify(&verifier, at: pos, of: "
            "String.self)";
      } else {
        code_.SetValue("MAINTYPE", ev.union_type.struct_def->fixed
                                       ? type
                                       : "ForwardOffset<" + type + ">");
        code_ +=
            "try {{MAINTYPE}}.verify(&verifier, at: pos, of: "
            "{{VALUETYPE}}.self)";
      }
      Outdent();
    }
    code_ += "}";
    Outdent();
    code_ += "})";
  }